

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

void __thiscall ServerService::receiveBroadcast(ServerService *this,int port,char *message)

{
  int iVar1;
  ssize_t sVar2;
  ostream *poVar3;
  size_t __n;
  socklen_t peerAddrLen;
  sockaddr local_140;
  char *local_130;
  sockaddr_in peerAddr;
  char peerName [30];
  undefined1 local_f8 [200];
  
  memset(local_f8,0,200);
  peerAddrLen = 0;
  peerName[0x10] = '\0';
  peerName[0x11] = '\0';
  peerName[0x12] = '\0';
  peerName[0x13] = '\0';
  peerName[0x14] = '\0';
  peerName[0x15] = '\0';
  peerName[0x16] = '\0';
  peerName[0x17] = '\0';
  peerName[0x18] = '\0';
  peerName[0x19] = '\0';
  peerName[0x1a] = '\0';
  peerName[0x1b] = '\0';
  peerName[0x1c] = '\0';
  peerName[0x1d] = '\0';
  peerName[0] = '\0';
  peerName[1] = '\0';
  peerName[2] = '\0';
  peerName[3] = '\0';
  peerName[4] = '\0';
  peerName[5] = '\0';
  peerName[6] = '\0';
  peerName[7] = '\0';
  peerName[8] = '\0';
  peerName[9] = '\0';
  peerName[10] = '\0';
  peerName[0xb] = '\0';
  peerName[0xc] = '\0';
  peerName[0xd] = '\0';
  peerName[0xe] = '\0';
  peerName[0xf] = '\0';
  local_140.sa_data[6] = '\0';
  local_140.sa_data[7] = '\0';
  local_140.sa_data[8] = '\0';
  local_140.sa_data[9] = '\0';
  local_140.sa_data[10] = '\0';
  local_140.sa_data[0xb] = '\0';
  local_140.sa_data[0xc] = '\0';
  local_140.sa_data[0xd] = '\0';
  peerAddr.sin_family = 0;
  peerAddr.sin_port = 0;
  peerAddr.sin_addr.s_addr = 0;
  peerAddr.sin_zero[0] = '\0';
  peerAddr.sin_zero[1] = '\0';
  peerAddr.sin_zero[2] = '\0';
  peerAddr.sin_zero[3] = '\0';
  peerAddr.sin_zero[4] = '\0';
  peerAddr.sin_zero[5] = '\0';
  peerAddr.sin_zero[6] = '\0';
  peerAddr.sin_zero[7] = '\0';
  local_140.sa_family = 2;
  local_140.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_140.sa_data[2] = '\0';
  local_140.sa_data[3] = '\0';
  local_140.sa_data[4] = '\0';
  local_140.sa_data[5] = '\0';
  iVar1 = socket(2,2,0);
  this->broadcastFD = iVar1;
  if (iVar1 != -1) {
    iVar1 = bind(iVar1,&local_140,0x10);
    if (iVar1 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Bind Broadcast Address Fail");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      local_130 = message;
      do {
        while( true ) {
          sVar2 = recvfrom(this->broadcastFD,local_f8,200,0,(sockaddr *)&peerAddr,&peerAddrLen);
          if (0 < (int)sVar2) break;
          poVar3 = std::operator<<((ostream *)&std::cout,"Receive Broadcast Message Error");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        inet_ntop(2,&peerAddr.sin_addr,peerName,0x1e);
      } while (peerName._0_8_ == 0x302e302e302e30);
      printf("Receive from %s, msg:%s\n",peerName,local_f8);
      __n = strlen(peerName);
      memcpy(local_130,peerName,__n);
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Create Broadcast Sock Fail");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void ServerService::receiveBroadcast(int port, char* message) {
    struct sockaddr_in ownAddr, peerAddr;
    char recvMsg[200] = {0};
    socklen_t peerAddrLen = 0;
    char peerName[30] = {0};
    int ret = 0;

    bzero(&ownAddr, sizeof(struct sockaddr_in));
    bzero(&peerAddr, sizeof(struct sockaddr_in));
    ownAddr.sin_family = AF_INET;
    ownAddr.sin_port = htons(port);
    ownAddr.sin_addr.s_addr = htonl(INADDR_ANY);

    broadcastFD = socket(AF_INET, SOCK_DGRAM, 0);
    if (broadcastFD == -1) {
        cout << "Create Broadcast Sock Fail" << endl;
        return;
    }

    ret = bind(broadcastFD, (struct sockaddr *) &ownAddr, sizeof(struct sockaddr_in));
    if (ret == -1) {
        cout << "Bind Broadcast Address Fail" << endl;
        return;
    }

    while (true) {
        ret = recvfrom(broadcastFD, recvMsg, sizeof(recvMsg), 0, (struct sockaddr *) &peerAddr, &peerAddrLen);
        if (ret > 0) {
            inet_ntop(AF_INET, &peerAddr.sin_addr.s_addr, peerName, sizeof(peerName));
            if (!strcmp("0.0.0.0", peerName)) {
                continue;
            } else {
                printf("Receive from %s, msg:%s\n", peerName, recvMsg);
                memcpy(message, peerName, strlen(peerName));
                break;
            }
        } else {
            cout << "Receive Broadcast Message Error" << endl;
        }
    }
    bzero(recvMsg, sizeof(recvMsg));
}